

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParseBlock(WastParser *this,Block *block)

{
  Result RVar1;
  Enum EVar2;
  Token local_98;
  char *local_48;
  size_type sStack_40;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_38;
  undefined8 uStack_30;
  
  RVar1 = ParseBlockDeclaration(this,&block->decl);
  EVar2 = Error;
  if (RVar1.enum_ != Error) {
    RVar1 = ParseInstrList(this,&block->exprs);
    if (RVar1.enum_ != Error) {
      GetToken(&local_98,this);
      local_38.offset = (size_t)local_98.loc.field_1.field_1.offset;
      uStack_30 = local_98.loc.field_1._8_8_;
      local_48 = local_98.loc.filename.data_;
      sStack_40 = local_98.loc.filename.size_;
      Token::~Token(&local_98);
      (block->end_loc).field_1.field_1.offset = local_38.offset;
      *(undefined8 *)((long)&(block->end_loc).field_1 + 8) = uStack_30;
      (block->end_loc).filename.data_ = local_48;
      (block->end_loc).filename.size_ = sStack_40;
      EVar2 = Ok;
    }
  }
  return (Result)EVar2;
}

Assistant:

Result WastParser::ParseBlock(Block* block) {
  WABT_TRACE(ParseBlock);
  CHECK_RESULT(ParseBlockDeclaration(&block->decl));
  CHECK_RESULT(ParseInstrList(&block->exprs));
  block->end_loc = GetLocation();
  return Result::Ok;
}